

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmReturnCommand.h
# Opt level: O0

cmCommand * __thiscall cmReturnCommand::Clone(cmReturnCommand *this)

{
  cmCommand *this_00;
  cmReturnCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmReturnCommand((cmReturnCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmReturnCommand; }